

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

void __thiscall
dap::BasicTypeInfo<dap::SetBreakpointsRequest>::copyConstruct
          (BasicTypeInfo<dap::SetBreakpointsRequest> *this,void *dst,void *src)

{
  std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::vector
            ((vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> *)dst,
             (vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> *)src);
  *(undefined1 *)((long)dst + 0x18) = *(undefined1 *)((long)src + 0x18);
  std::vector<dap::integer,_std::allocator<dap::integer>_>::vector
            ((vector<dap::integer,_std::allocator<dap::integer>_> *)((long)dst + 0x20),
             (vector<dap::integer,_std::allocator<dap::integer>_> *)((long)src + 0x20));
  *(undefined1 *)((long)dst + 0x38) = *(undefined1 *)((long)src + 0x38);
  Source::Source((Source *)((long)dst + 0x40),(Source *)((long)src + 0x40));
  *(undefined1 *)((long)dst + 0x170) = *(undefined1 *)((long)src + 0x170);
  *(undefined1 *)((long)dst + 0x171) = *(undefined1 *)((long)src + 0x171);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }